

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O0

void * google::protobuf::Arena::CopyConstruct<google::protobuf::Int32Value>(Arena *arena,void *from)

{
  undefined8 local_28;
  void *mem;
  void *from_local;
  Arena *arena_local;
  
  if (arena == (Arena *)0x0) {
    local_28 = (Int32Value *)operator_new(0x20);
  }
  else {
    local_28 = (Int32Value *)AllocateAligned(arena,0x20,8);
  }
  Int32Value::Int32Value(local_28,arena,(Int32Value *)from);
  return local_28;
}

Assistant:

PROTOBUF_NOINLINE void* PROTOBUF_NONNULL Arena::CopyConstruct(
    Arena* PROTOBUF_NULLABLE arena, const void* PROTOBUF_NONNULL from) {
  // If the object is larger than half a cache line, prefetch it.
  // This way of prefetching is a little more aggressive than if we
  // condition off a whole cache line, but benchmarks show better results.
  if (sizeof(T) > ABSL_CACHELINE_SIZE / 2) {
    PROTOBUF_PREFETCH_WITH_OFFSET(from, 64);
  }
  static_assert(is_destructor_skippable<T>::value, "");
  void* mem = arena != nullptr ? arena->AllocateAligned(sizeof(T))
                               : ::operator new(sizeof(T));
  return new (mem) T(arena, *static_cast<const T*>(from));
}